

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

bool __thiscall QVLABase<char>::contains<char>(QVLABase<char> *this,char *t)

{
  char *pcVar1;
  const_iterator pcVar2;
  char *in_RSI;
  QVLABase<char> *in_RDI;
  char *i;
  char *b;
  const_iterator local_28;
  
  pcVar2 = begin((QVLABase<char> *)0x8ca921);
  local_28 = end(in_RDI);
  do {
    if (local_28 == pcVar2) {
      return false;
    }
    pcVar1 = local_28 + -1;
    local_28 = local_28 + -1;
  } while (*pcVar1 != *in_RSI);
  return true;
}

Assistant:

Q_INLINE_TEMPLATE bool QVLABase<T>::contains(const AT &t) const
{
    const T *b = begin();
    const T *i = end();
    while (i != b) {
        if (*--i == t)
            return true;
    }
    return false;
}